

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::Token> * __thiscall
pstd::optional<pbrt::Token>::operator=(optional<pbrt::Token> *this,Token *v)

{
  Token *__dest;
  optional<pbrt::Token> *in_RSI;
  optional<pbrt::Token> *in_RDI;
  
  reset(in_RSI);
  __dest = ptr((optional<pbrt::Token> *)0x4a9995);
  memcpy(__dest,in_RSI,0x28);
  in_RDI->set = true;
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(const T &v) {
        reset();
        new (ptr()) T(v);
        set = true;
        return *this;
    }